

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

bool uWS::WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::consumeContinuation
               (char **src,uint *length,WebSocketState<true> *wState,void *user)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  byte *in_RDX;
  uint *in_RSI;
  long *in_RDI;
  int s;
  int i;
  int n;
  WebSocketState<true> *in_stack_00000178;
  bool in_stack_00000187;
  int in_stack_00000188;
  uint in_stack_0000018c;
  size_t in_stack_00000190;
  char *in_stack_00000198;
  void *in_stack_000001b0;
  int local_30;
  bool local_1;
  
  if (*in_RSI < *(uint *)(in_RDX + 0x10)) {
    unmaskInplace((char *)*in_RDI,(char *)(*in_RDI + (ulong)(((*in_RSI >> 2) + 1) * 4)),
                  (char *)(in_RDX + 0x14));
    *(uint *)(in_RDX + 0x10) = *(int *)(in_RDX + 0x10) - *in_RSI;
    bVar3 = WebSocketContext<true,_true>::handleFragment
                      (in_stack_00000198,in_stack_00000190,in_stack_0000018c,in_stack_00000188,
                       in_stack_00000187,in_stack_00000178,in_stack_000001b0);
    if (bVar3) {
      local_1 = false;
    }
    else {
      if ((*in_RSI & 3) != 0) {
        rotateMask(4 - (*in_RSI & 3),(char *)(in_RDX + 0x14));
      }
      local_1 = false;
    }
  }
  else {
    uVar1 = *(uint *)(in_RDX + 0x10);
    unmaskInplace((char *)*in_RDI,(char *)(*in_RDI + (long)(int)((uVar1 >> 2) << 2)),
                  (char *)(in_RDX + 0x14));
    local_30 = 0;
    uVar2 = *(uint *)(in_RDX + 0x10);
    for (; local_30 < (int)(uVar2 & 3); local_30 = local_30 + 1) {
      lVar4 = (long)(int)((uVar1 >> 2) * 4 + local_30);
      *(byte *)(*in_RDI + lVar4) = *(byte *)(*in_RDI + lVar4) ^ in_RDX[(long)local_30 + 0x14];
    }
    bVar3 = WebSocketContext<true,_true>::handleFragment
                      (in_stack_00000198,in_stack_00000190,in_stack_0000018c,in_stack_00000188,
                       in_stack_00000187,in_stack_00000178,in_stack_000001b0);
    if (bVar3) {
      local_1 = false;
    }
    else {
      if ((char)*in_RDX < '\0') {
        *in_RDX = *in_RDX & 0x9f | (((char)(*in_RDX << 1) >> 6) - 1U & 3) << 5;
      }
      *in_RDI = *in_RDI + (ulong)*(uint *)(in_RDX + 0x10);
      *in_RSI = *in_RSI - *(int *)(in_RDX + 0x10);
      *in_RDX = *in_RDX & 0xfe | 1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static inline bool consumeContinuation(char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (wState->remainingBytes <= length) {
            if (isServer) {
                int n = wState->remainingBytes >> 2;
                unmaskInplace(src, src + n * 4, wState->mask);
                for (int i = 0, s = wState->remainingBytes % 4; i < s; i++) {
                    src[n * 4 + i] ^= wState->mask[i];
                }
            }

            if (Impl::handleFragment(src, wState->remainingBytes, 0, wState->state.opCode[wState->state.opStack], wState->state.lastFin, wState, user)) {
                return false;
            }

            if (wState->state.lastFin) {
                wState->state.opStack--;
            }

            src += wState->remainingBytes;
            length -= wState->remainingBytes;
            wState->state.wantsHead = true;
            return true;
        } else {
            if (isServer) {
                unmaskInplace(src, src + ((length >> 2) + 1) * 4, wState->mask);
            }

            wState->remainingBytes -= length;
            if (Impl::handleFragment(src, length, wState->remainingBytes, wState->state.opCode[wState->state.opStack], wState->state.lastFin, wState, user)) {
                return false;
            }

            if (isServer && length % 4) {
                rotateMask(4 - (length % 4), wState->mask);
            }
            return false;
        }
    }